

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_app.cpp
# Opt level: O1

void __thiscall Clasp::Cli::ClaspAppBase::onUnsat(ClaspAppBase *this)

{
  Model *in_RDX;
  Solver *in_RSI;
  
  onUnsat((ClaspAppBase *)&this[-1].clasp_,in_RSI,in_RDX);
  return;
}

Assistant:

bool ClaspAppBase::onUnsat(const Solver& s, const Model& m) {
	bool ret = true;
	if (out_.get() && !out_->quiet()) {
		blockSignals();
		ret = out_->onUnsat(s, m);
		unblockSignals(true);
	}
	return ret;
}